

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall
wallet::WalletBatch::WriteCScript(WalletBatch *this,uint160 *hash,CScript *redeemScript)

{
  byte bVar1;
  undefined8 in_RDI;
  undefined1 fOverwrite;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint160>
  *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  CScript *value;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  WalletBatch *in_stack_ffffffffffffffa0;
  CScript local_40;
  long local_8;
  
  fOverwrite = (undefined1)((ulong)in_RDI >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  value = &local_40;
  std::make_pair<std::__cxx11::string_const&,uint160_const&>
            (in_stack_ffffffffffffff80,(uint160 *)in_stack_ffffffffffffff78);
  bVar1 = WriteIC<std::pair<std::__cxx11::string,uint160>,CScript>
                    (in_stack_ffffffffffffffa0,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint160>
                      *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),value,
                     (bool)fOverwrite);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint160>::
  ~pair(in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteCScript(const uint160& hash, const CScript& redeemScript)
{
    return WriteIC(std::make_pair(DBKeys::CSCRIPT, hash), redeemScript, false);
}